

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O0

string * __thiscall
LumaQuantizer::name_abi_cxx11_(string *__return_storage_ptr__,LumaQuantizer *this,ptf_t ptf)

{
  ptf_t ptf_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Perceptual - Ferwerda\'s t.v.i.");
    break;
  case 1:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Perceptual quantizer (PQ, SMPTE ST 2084)");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Logarithmic");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"JND HDR-VDP");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Linear scaling");
    break;
  default:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Undefined");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LumaQuantizer::name(ptf_t ptf)
{
    std::string name;
    switch (ptf)
    {
    case PTF_PQ:
        name = "Perceptual quantizer (PQ, SMPTE ST 2084)";
        break;
    case PTF_LOG:
        name = "Logarithmic";
        break;
    case PTF_JND_HDRVDP:
        name = "JND HDR-VDP";
        break;
    case PTF_PSI:
        name = "Perceptual - Ferwerda's t.v.i.";
        break;
    case PTF_LINEAR:
        name = "Linear scaling";
        break;
    default:
        name = "Undefined";
    }
    
    return name;
}